

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O1

int Fra_SmlCheckOutput(Fra_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Aig_Obj_t *pObjPo;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  pVVar3 = p->pManAig->vCos;
  lVar6 = (long)pVVar3->nSize;
  if (lVar6 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar4 = pVVar3->pArray;
  uVar9 = *(ulong *)((long)*ppvVar4 + 8);
  if ((((uint)uVar9 ^ *(uint *)((uVar9 & 0xfffffffffffffffe) + 0x18) >> 3) & 1) == 0) {
    lVar7 = 0;
    do {
      pObjPo = (Aig_Obj_t *)ppvVar4[lVar7];
      uVar9 = (ulong)pObjPo->pFanin0 & 0xfffffffffffffffe;
      lVar5 = *(long *)(*(long *)(uVar9 + 0x28) + 0x38);
      iVar1 = *(int *)(lVar5 + 0x14);
      iVar2 = *(int *)(lVar5 + 0x18);
      if (iVar2 < iVar1) {
        lVar8 = 0;
        do {
          if (*(int *)(lVar5 + (long)(*(int *)(uVar9 + 0x24) * iVar1) * 4 + (long)iVar2 * 4 + 0x28 +
                      lVar8 * 4) != 0) {
            Fra_SmlCheckOutputSavePattern(p,pObjPo);
            return 1;
          }
          lVar8 = lVar8 + 1;
        } while (iVar1 - iVar2 != (int)lVar8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar6);
    return 0;
  }
  __assert_fail("Aig_ObjFanin0(pObj)->fPhase == (unsigned)Aig_ObjFaninC0(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                ,0x14c,"int Fra_SmlCheckOutput(Fra_Man_t *)");
}

Assistant:

int Fra_SmlCheckOutput( Fra_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    // make sure the reference simulation pattern does not detect the bug
    pObj = Aig_ManCo( p->pManAig, 0 );
    assert( Aig_ObjFanin0(pObj)->fPhase == (unsigned)Aig_ObjFaninC0(pObj) ); 
    Aig_ManForEachCo( p->pManAig, pObj, i )
    {
        if ( !Fra_SmlNodeIsConst( Aig_ObjFanin0(pObj) ) )
        {
            // create the counter-example from this pattern
            Fra_SmlCheckOutputSavePattern( p, pObj );
            return 1;
        }
    }
    return 0;
}